

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CallContextHooks(ImGuiContext *ctx,ImGuiContextHookType hook_type)

{
  ImGuiContextHook *pIVar1;
  int n;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < (ctx->Hooks).Size; lVar2 = lVar2 + 1) {
    pIVar1 = (ctx->Hooks).Data;
    if (*(ImGuiContextHookType *)(pIVar1 + lVar3 + 4) == hook_type) {
      (**(code **)(pIVar1 + lVar3 + 0x10))(ctx,pIVar1 + lVar3);
    }
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void ImGui::CallContextHooks(ImGuiContext* ctx, ImGuiContextHookType hook_type)
{
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].Type == hook_type)
            g.Hooks[n].Callback(&g, &g.Hooks[n]);
}